

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TonkServerTest.cpp
# Opt level: O3

void __thiscall
MyServer::OnAdvertisement
          (MyServer *this,string *ipString,uint16_t port,uint8_t *data,uint32_t bytes)

{
  ostringstream *poVar1;
  OutputWorker *pOVar2;
  uint8_t pong [5];
  undefined1 local_1b0 [392];
  
  if (bytes == 5) {
    if (*data == 'e') {
      if (2 < (int)Logger.ChannelMinLevel) {
        return;
      }
      poVar1 = (ostringstream *)(local_1b0 + 0x10);
      local_1b0._0_8_ = Logger.ChannelName;
      local_1b0._8_4_ = Info;
      std::__cxx11::ostringstream::ostringstream(poVar1);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,"Advertisement PONG received from ",0x21);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)poVar1,(ipString->_M_dataplus)._M_p,ipString->_M_string_length);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," - ",3);
      std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes",6);
      pOVar2 = logger::OutputWorker::GetInstance();
      logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b0);
      goto LAB_00104f8a;
    }
    if (*data == 'd') {
      if ((int)Logger.ChannelMinLevel < 3) {
        poVar1 = (ostringstream *)(local_1b0 + 0x10);
        local_1b0._0_8_ = Logger.ChannelName;
        local_1b0._8_4_ = Info;
        std::__cxx11::ostringstream::ostringstream(poVar1);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,"Advertisement PING received from ",0x21);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)poVar1,(ipString->_M_dataplus)._M_p,ipString->_M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," - ",3);
        std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes",6);
        pOVar2 = logger::OutputWorker::GetInstance();
        logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b0);
        std::__cxx11::ostringstream::~ostringstream(poVar1);
        std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
      }
      local_1b0._0_5_ = 0x400000000;
      local_1b0._0_4_ = 0x3020165;
      tonk::SDKSocket::Advertise(&this->super_SDKSocket,ipString,port,local_1b0,5);
      return;
    }
  }
  if (4 < (int)Logger.ChannelMinLevel) {
    return;
  }
  poVar1 = (ostringstream *)(local_1b0 + 0x10);
  local_1b0._0_8_ = Logger.ChannelName;
  local_1b0._8_4_ = Error;
  std::__cxx11::ostringstream::ostringstream(poVar1);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,Logger.Prefix._M_dataplus._M_p,Logger.Prefix._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,"Unknown advertisement received from ",0x24);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)poVar1,(ipString->_M_dataplus)._M_p,ipString->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,":",1);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," - ",3);
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1," bytes",6);
  pOVar2 = logger::OutputWorker::GetInstance();
  logger::OutputWorker::Write(pOVar2,(LogStringBuffer *)local_1b0);
LAB_00104f8a:
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)(local_1b0 + 0x10));
  std::ios_base::~ios_base((ios_base *)(local_1b0 + 0x80));
  return;
}

Assistant:

void MyServer::OnAdvertisement(
    const std::string& ipString, ///< Source IP address of advertisement
    uint16_t               port, ///< Source port address of advertisement
    const uint8_t*         data,  ///< Pointer to a buffer containing the message data
    uint32_t              bytes)  ///< Number of bytes in the message
{
    if (bytes == test::kPongBytes)
    {
        if (data[0] == test::ID_Advertise_Ping)
        {
            Logger.Info("Advertisement PING received from ", ipString, ":", port, " - ", bytes, " bytes");

            uint8_t pong[test::kPongBytes] = {
                test::ID_Advertise_Pong, 1, 2, 3, 4
            };
            Advertise(ipString, port, pong, test::kPongBytes);
            return;
        }
        if (data[0] == test::ID_Advertise_Pong)
        {
            Logger.Info("Advertisement PONG received from ", ipString, ":", port, " - ", bytes, " bytes");
            return;
        }
    }

    Logger.Error("Unknown advertisement received from ", ipString, ":", port, " - ", bytes, " bytes");
}